

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O3

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,char *str)

{
  size_t sVar1;
  int Val;
  
  sVar1 = strlen(str);
  Val = (int)sVar1 + 1;
  operator<<(this,Val);
  (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,str,(long)Val);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(const char* str) {
    // save string length, including null termination
    int mlength = (int)strlen(str) + 1;
    *this << mlength;
    // save all bytes including null termination
    this->Output(str, mlength);
    return *this;
}